

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGhsMultiGenerator::WriteMacros
          (cmGlobalGhsMultiGenerator *this,ostream *fout,cmLocalGenerator *root)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  ostream *poVar2;
  cmValue cVar3;
  string *arg;
  _Alloc_hider _Var4;
  string_view arg_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedList;
  char local_49;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(fout,"macro PROJ_NAME=",0x10);
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_48,root);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (fout,local_48._M_dataplus._M_p,local_48._M_string_length);
  local_49 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_49,1);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  this_00 = root->Makefile;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"GHS_GPJ_MACROS","");
  cVar3 = cmMakefile::GetDefinition(this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (cVar3.Value != (string *)0x0) {
    arg_00._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
    arg_00._M_len = (cVar3.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_48,arg_00,false);
    if (local_48._M_dataplus._M_p != (pointer)local_48._M_string_length) {
      _Var4._M_p = local_48._M_dataplus._M_p;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(fout,"macro ",6);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (fout,*(char **)_Var4._M_p,*(undefined8 *)((long)_Var4._M_p + 8));
        local_49 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_49,1);
        _Var4._M_p = _Var4._M_p + 0x20;
      } while (_Var4._M_p != (pointer)local_48._M_string_length);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteMacros(std::ostream& fout,
                                            cmLocalGenerator* root)
{
  fout << "macro PROJ_NAME=" << root->GetProjectName() << '\n';
  cmValue ghsGpjMacros = root->GetMakefile()->GetDefinition("GHS_GPJ_MACROS");
  if (ghsGpjMacros) {
    std::vector<std::string> expandedList = cmExpandedList(*ghsGpjMacros);
    for (std::string const& arg : expandedList) {
      fout << "macro " << arg << '\n';
    }
  }
}